

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * __thiscall
svg::Stroke::toString_abi_cxx11_(string *__return_storage_ptr__,Stroke *this,Layout *layout)

{
  ostream *poVar1;
  string *in_R8;
  stringstream ss;
  allocator local_29c;
  allocator local_29b;
  allocator local_29a;
  allocator local_299;
  string local_298;
  double local_278;
  string local_270;
  string local_250;
  string local_230 [32];
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if (0.0 < this->width || this->width == 0.0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__cxx11::string::string((string *)&local_270,"stroke-width",&local_299);
    local_278 = this->width * layout->scale;
    std::__cxx11::string::string((string *)&local_298,"",&local_29a);
    attribute<double>(&local_250,&local_270,&local_278,&local_298);
    poVar1 = std::operator<<(local_1a0,(string *)&local_250);
    std::__cxx11::string::string(local_230,"stroke",&local_29b);
    Color::toString_abi_cxx11_(&local_1d0,&this->color,layout);
    std::__cxx11::string::string((string *)&local_1f0,"",&local_29c);
    attribute<std::__cxx11::string>(&local_210,(svg *)local_230,&local_1d0,&local_1f0,in_R8);
    std::operator<<(poVar1,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_270);
    if (this->nonScaling == true) {
      std::__cxx11::string::string((string *)&local_270,"vector-effect",(allocator *)&local_210);
      std::__cxx11::string::string((string *)&local_298,"",(allocator *)local_230);
      attribute<char[19]>(&local_250,&local_270,(char (*) [19])"non-scaling-stroke",&local_298);
      std::operator<<(local_1a0,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_270);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            // If stroke width is invalid.
            if (width < 0)
                return std::string();

            std::stringstream ss;
            ss << attribute("stroke-width", translateScale(width, layout)) << attribute("stroke", color.toString(layout));
            if (nonScaling)
               ss << attribute("vector-effect", "non-scaling-stroke");
            return ss.str();
        }